

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

char * sinc_get_name(int src_enum)

{
  int src_enum_local;
  char *local_8;
  
  if (src_enum == 0) {
    local_8 = "Best Sinc Interpolator";
  }
  else if (src_enum == 1) {
    local_8 = "Medium Sinc Interpolator";
  }
  else if (src_enum == 2) {
    local_8 = "Fastest Sinc Interpolator";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char*
sinc_get_name (int src_enum)
{
	switch (src_enum)
	{	case SRC_SINC_BEST_QUALITY :
			return "Best Sinc Interpolator" ;

		case SRC_SINC_MEDIUM_QUALITY :
			return "Medium Sinc Interpolator" ;

		case SRC_SINC_FASTEST :
			return "Fastest Sinc Interpolator" ;

		default: break ;
		} ;

	return NULL ;
}